

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.h
# Opt level: O0

void __thiscall
presolve::dev_kkt_check::State::State
          (State *this,HighsInt numCol_,HighsInt numRow_,vector<int,_std::allocator<int>_> *Astart_,
          vector<int,_std::allocator<int>_> *Aend_,vector<int,_std::allocator<int>_> *Aindex_,
          vector<double,_std::allocator<double>_> *Avalue_,
          vector<int,_std::allocator<int>_> *ARstart_,vector<int,_std::allocator<int>_> *ARindex_,
          vector<double,_std::allocator<double>_> *ARvalue_,
          vector<double,_std::allocator<double>_> *colCost_,
          vector<double,_std::allocator<double>_> *colLower_,
          vector<double,_std::allocator<double>_> *colUpper_,
          vector<double,_std::allocator<double>_> *rowLower_,
          vector<double,_std::allocator<double>_> *rowUpper_,
          vector<int,_std::allocator<int>_> *flagCol_,vector<int,_std::allocator<int>_> *flagRow_,
          vector<double,_std::allocator<double>_> *colValue_,
          vector<double,_std::allocator<double>_> *colDual_,
          vector<double,_std::allocator<double>_> *rowValue_,
          vector<double,_std::allocator<double>_> *rowDual_,
          vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *col_status_,
          vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *row_status_)

{
  vector<int,_std::allocator<int>_> *Aindex__local;
  vector<int,_std::allocator<int>_> *Aend__local;
  vector<int,_std::allocator<int>_> *Astart__local;
  HighsInt numRow__local;
  HighsInt numCol__local;
  State *this_local;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  this->Astart = Astart_;
  this->Aend = Aend_;
  this->Aindex = Aindex_;
  this->Avalue = Avalue_;
  this->ARstart = ARstart_;
  this->ARindex = ARindex_;
  this->ARvalue = ARvalue_;
  this->colCost = colCost_;
  this->colLower = colLower_;
  this->colUpper = colUpper_;
  this->rowLower = rowLower_;
  this->rowUpper = rowUpper_;
  this->flagCol = flagCol_;
  this->flagRow = flagRow_;
  this->colValue = colValue_;
  this->colDual = colDual_;
  this->rowValue = rowValue_;
  this->rowDual = rowDual_;
  this->col_status = col_status_;
  this->row_status = row_status_;
  return;
}

Assistant:

State(
      const HighsInt numCol_, const HighsInt numRow_,
      const std::vector<HighsInt>& Astart_, const std::vector<HighsInt>& Aend_,
      const std::vector<HighsInt>& Aindex_, const std::vector<double>& Avalue_,
      const std::vector<HighsInt>& ARstart_,
      const std::vector<HighsInt>& ARindex_,
      const std::vector<double>& ARvalue_, const std::vector<double>& colCost_,
      const std::vector<double>& colLower_,
      const std::vector<double>& colUpper_,
      const std::vector<double>& rowLower_,
      const std::vector<double>& rowUpper_,
      const std::vector<HighsInt>& flagCol_,
      const std::vector<HighsInt>& flagRow_,
      const std::vector<double>& colValue_, const std::vector<double>& colDual_,
      const std::vector<double>& rowValue_, const std::vector<double>& rowDual_,
      const std::vector<HighsBasisStatus>& col_status_,
      const std::vector<HighsBasisStatus>& row_status_)
      : numCol(numCol_),
        numRow(numRow_),
        Astart(Astart_),
        Aend(Aend_),
        Aindex(Aindex_),
        Avalue(Avalue_),
        ARstart(ARstart_),
        ARindex(ARindex_),
        ARvalue(ARvalue_),
        colCost(colCost_),
        colLower(colLower_),
        colUpper(colUpper_),
        rowLower(rowLower_),
        rowUpper(rowUpper_),
        flagCol(flagCol_),
        flagRow(flagRow_),
        colValue(colValue_),
        colDual(colDual_),
        rowValue(rowValue_),
        rowDual(rowDual_),
        col_status(col_status_),
        row_status(row_status_) {}